

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_72_17_20e643c5 *
qclab::qgates::lambda_QGate2<float>
          (anon_class_72_17_20e643c5 *__return_storage_ptr__,Op op,SquareMatrix<float> *mat2,
          float *vector)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int64_t iVar15;
  float *pfVar16;
  float *local_a8;
  anon_class_72_17_20e643c5 f;
  float m44;
  float m43;
  float m42;
  float m41;
  float m34;
  float m33;
  float m32;
  float m31;
  float m24;
  float m23;
  float m22;
  float m21;
  float m14;
  float m13;
  float m12;
  float m11;
  float *vector_local;
  SquareMatrix<float> *mat2_local;
  Op op_local;
  
  iVar15 = dense::SquareMatrix<float>::size(mat2);
  if (iVar15 == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,mat2);
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,0,0);
    fVar1 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,0,1);
    fVar2 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,0,2);
    fVar3 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,0,3);
    fVar4 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,1,0);
    fVar5 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,1,1);
    fVar6 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,1,2);
    fVar7 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,1,3);
    fVar8 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,2,0);
    fVar9 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,2,1);
    fVar10 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,2,2);
    fVar11 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,2,3);
    fVar12 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,3,0);
    fVar13 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,3,1);
    fVar14 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,3,2);
    f.m44 = *pfVar16;
    pfVar16 = dense::SquareMatrix<float>::operator()(mat2,3,3);
    f.m42 = *pfVar16;
    f.m41 = f.m44;
    local_a8 = vector;
    f.vector._0_4_ = fVar1;
    f.vector._4_4_ = fVar2;
    f.m11 = fVar3;
    f.m12 = fVar4;
    f.m13 = fVar5;
    f.m14 = fVar6;
    f.m21 = fVar7;
    f.m22 = fVar8;
    f.m23 = fVar9;
    f.m24 = fVar10;
    f.m31 = fVar11;
    f.m32 = fVar12;
    f.m33 = fVar13;
    f.m34 = fVar14;
    f.m43 = f.m42;
    memcpy(__return_storage_ptr__,&local_a8,0x48);
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = float]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }